

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::setObjectName(QObject *this,QAnyStringView name)

{
  long lVar1;
  bool bVar2;
  QObjectPrivate *pQVar3;
  long in_FS_OFFSET;
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  *in_stack_00000018;
  QObjectPrivate *d;
  QAnyStringView *in_stack_ffffffffffffff88;
  QAnyStringView *in_stack_ffffffffffffff90;
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  *this_00;
  QString *in_stack_ffffffffffffff98;
  QObjectPrivate *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QObject *)0x3ed58f);
  QObjectPrivate::ensureExtraData(in_stack_ffffffffffffffa0);
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)in_stack_ffffffffffffffa0);
  QPropertyData<QString>::valueBypassingBindings
            (&(pQVar3->extraData->objectName).super_QPropertyData<QString>);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  bVar2 = ::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar2) {
    this_00 = &pQVar3->extraData->objectName;
    QAnyStringView::toString((QAnyStringView *)this_00);
    QPropertyData<QString>::setValueBypassingBindings
              (&this_00->super_QPropertyData<QString>,(rvalue_ref)in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x3ed625);
    QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
    ::notify(in_stack_00000018);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObject::setObjectName(QAnyStringView name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name.toString());
        d->extraData->objectName.notify(); // also emits a signal
    }
}